

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderLayeredFramebufferDepth::deinit(GeometryShaderLayeredFramebufferDepth *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_read_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_read_fbo_id);
  }
  if (this->m_to_a_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_a_id);
  }
  if (this->m_to_b_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_b_id);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredFramebufferDepth::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean up */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
	}

	if (m_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_read_fbo_id);
	}

	if (m_to_a_id != 0)
	{
		gl.deleteTextures(1, &m_to_a_id);
	}

	if (m_to_b_id != 0)
	{
		gl.deleteTextures(1, &m_to_b_id);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}